

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard.c
# Opt level: O0

void dlload_externs(char *libname,cod_extern_entry *externs)

{
  cod_extern_entry *externs_local;
  char *libname_local;
  
  return;
}

Assistant:

static void 
dlload_externs(char *libname, cod_extern_entry *externs)
{
#if NO_DYNAMIC_LINKING
    return;
#else
    int i = 0;
    char *name = malloc(strlen(libname) + strlen(LIBRARY_EXT) + 1);
    strcpy(name, libname);
    strcat(name, LIBRARY_EXT);
    void *handle = dlopen(name, RTLD_LAZY);
    free(name);
    while(externs[i].extern_name) {
	externs[i].extern_value = dlsym(handle, externs[i].extern_name);
	i++;
    }
#endif
}